

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

void __thiscall adios2::Engine::Get(Engine *this,VariableNT *variable,void *data,Mode launch)

{
  Engine *pointer;
  VariableBase *pointer_00;
  complex *pcVar1;
  Mode MVar2;
  string local_70;
  string local_50;
  
  pointer = this->m_Engine;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"in call to Engine::Get","");
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pointer_00 = variable->m_Variable;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for variable in call to Engine::Get","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  MVar2 = (Mode)data;
  if (*(int *)((string *)variable->m_Variable + 0x28) == 0xe) {
    adios2::core::Engine::Get<std::__cxx11::string>
              ((Variable *)this->m_Engine,(string *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 0xf) {
    adios2::core::Engine::Get<char>((Variable *)this->m_Engine,(char *)variable->m_Variable,MVar2);
  }
  if (*(int *)((signed *)variable->m_Variable + 0x28) == 1) {
    adios2::core::Engine::Get<signed_char>
              ((Variable *)this->m_Engine,(signed *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 2) {
    adios2::core::Engine::Get<short>((Variable *)this->m_Engine,(short *)variable->m_Variable,MVar2)
    ;
  }
  if (*(int *)(variable->m_Variable + 0x28) == 3) {
    adios2::core::Engine::Get<int>((Variable *)this->m_Engine,(int *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 4) {
    adios2::core::Engine::Get<long>((Variable *)this->m_Engine,(long *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 5) {
    adios2::core::Engine::Get<unsigned_char>
              ((Variable *)this->m_Engine,(uchar *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 6) {
    adios2::core::Engine::Get<unsigned_short>
              ((Variable *)this->m_Engine,(ushort *)variable->m_Variable,MVar2);
  }
  if (*(uint *)(variable->m_Variable + 0x28) == 7) {
    adios2::core::Engine::Get<unsigned_int>
              ((Variable *)this->m_Engine,(uint *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 8) {
    adios2::core::Engine::Get<unsigned_long>
              ((Variable *)this->m_Engine,(ulong *)variable->m_Variable,MVar2);
  }
  if (*(float *)(variable->m_Variable + 0x28) == 1.26117e-44) {
    adios2::core::Engine::Get<float>((Variable *)this->m_Engine,(float *)variable->m_Variable,MVar2)
    ;
  }
  if (*(int *)(variable->m_Variable + 0x28) == 10) {
    adios2::core::Engine::Get<double>
              ((Variable *)this->m_Engine,(double *)variable->m_Variable,MVar2);
  }
  if (*(int *)(variable->m_Variable + 0x28) == 0xb) {
    adios2::core::Engine::Get<long_double>
              ((Variable *)this->m_Engine,(longdouble *)variable->m_Variable,MVar2);
  }
  if (*(int *)((complex *)variable->m_Variable + 0x28) == 0xc) {
    adios2::core::Engine::Get<std::complex<float>>
              ((Variable *)this->m_Engine,(complex *)variable->m_Variable,MVar2);
  }
  pcVar1 = (complex *)variable->m_Variable;
  if (*(int *)(pcVar1 + 0x28) == 0x10) {
    adios2::core::Engine::Get((VariableStruct *)this->m_Engine,pcVar1,MVar2);
  }
  else if (*(int *)(pcVar1 + 0x28) == 0xd) {
    adios2::core::Engine::Get<std::complex<double>>((Variable *)this->m_Engine,pcVar1,MVar2);
  }
  return;
}

Assistant:

void Engine::Get(VariableNT &variable, void *data, const Mode launch)
{
    adios2::helper::CheckForNullptr(m_Engine, "in call to Engine::Get");
    adios2::helper::CheckForNullptr(variable.m_Variable, "for variable in call to Engine::Get");
#define declare_type(T)                                                                            \
    if (variable.m_Variable->m_Type == helper::GetDataType<T>())                                   \
    {                                                                                              \
        m_Engine->Get(*reinterpret_cast<core::Variable<T> *>(variable.m_Variable),                 \
                      reinterpret_cast<T *>(data), launch);                                        \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (variable.m_Variable->m_Type == DataType::Struct)
    {
        m_Engine->Get(*reinterpret_cast<core::VariableStruct *>(variable.m_Variable), data, launch);
    }
}